

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe.cpp
# Opt level: O1

void fe_sub(i32 *h,i32 *f,i32 *g)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  
  iVar1 = f[1];
  iVar2 = f[2];
  iVar3 = f[3];
  iVar4 = f[4];
  iVar5 = f[5];
  iVar6 = f[6];
  iVar7 = f[7];
  iVar8 = f[8];
  iVar9 = f[9];
  iVar10 = g[1];
  iVar11 = g[2];
  iVar12 = g[3];
  iVar13 = g[4];
  iVar14 = g[5];
  iVar15 = g[6];
  iVar16 = g[7];
  iVar17 = g[8];
  iVar18 = g[9];
  *h = *f - *g;
  h[1] = iVar1 - iVar10;
  h[2] = iVar2 - iVar11;
  h[3] = iVar3 - iVar12;
  h[4] = iVar4 - iVar13;
  h[5] = iVar5 - iVar14;
  h[6] = iVar6 - iVar15;
  h[7] = iVar7 - iVar16;
  h[8] = iVar8 - iVar17;
  h[9] = iVar9 - iVar18;
  return;
}

Assistant:

void fe_sub(fe h, const fe f, const fe g) {
    i32 f0 = f[0];
    i32 f1 = f[1];
    i32 f2 = f[2];
    i32 f3 = f[3];
    i32 f4 = f[4];
    i32 f5 = f[5];
    i32 f6 = f[6];
    i32 f7 = f[7];
    i32 f8 = f[8];
    i32 f9 = f[9];
    i32 g0 = g[0];
    i32 g1 = g[1];
    i32 g2 = g[2];
    i32 g3 = g[3];
    i32 g4 = g[4];
    i32 g5 = g[5];
    i32 g6 = g[6];
    i32 g7 = g[7];
    i32 g8 = g[8];
    i32 g9 = g[9];
    i32 h0 = f0 - g0;
    i32 h1 = f1 - g1;
    i32 h2 = f2 - g2;
    i32 h3 = f3 - g3;
    i32 h4 = f4 - g4;
    i32 h5 = f5 - g5;
    i32 h6 = f6 - g6;
    i32 h7 = f7 - g7;
    i32 h8 = f8 - g8;
    i32 h9 = f9 - g9;

    h[0] = h0;
    h[1] = h1;
    h[2] = h2;
    h[3] = h3;
    h[4] = h4;
    h[5] = h5;
    h[6] = h6;
    h[7] = h7;
    h[8] = h8;
    h[9] = h9;
}